

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

Format embree::Texture::string_to_format(string *str)

{
  Format FVar1;
  bool bVar2;
  runtime_error *this;
  
  bVar2 = std::operator==(str,"RGBA8");
  if (bVar2) {
    FVar1 = RGBA8;
  }
  else {
    bVar2 = std::operator==(str,"RGB8");
    if (bVar2) {
      FVar1 = RGB8;
    }
    else {
      bVar2 = std::operator==(str,"FLOAT32");
      if (!bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid texture format string");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      FVar1 = FLOAT32;
    }
  }
  return FVar1;
}

Assistant:

Texture::Format Texture::string_to_format(const std::string& str)
  {
    if      (str == "RGBA8") return RGBA8;
    else if (str == "RGB8")  return RGB8;
    else if (str == "FLOAT32") return FLOAT32;
    else THROW_RUNTIME_ERROR("invalid texture format string");
  }